

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

Pipe __thiscall perfetto::base::Pipe::Create(Pipe *this,Flags flags)

{
  ScopedPlatformHandle *this_00;
  code *pcVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint *puVar5;
  char *pcVar6;
  char *pcVar7;
  PlatformHandle fds [2];
  
  iVar2 = pipe(fds);
  if (iVar2 != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    pcVar6 = strerror(uVar3);
    pcVar7 = "PERFETTO_CHECK(pipe(fds) == 0)";
    iVar2 = 0x1642;
LAB_0029b6cf:
    LogMessage(kLogError,pcVar4,iVar2,"%s (errno: %d, %s)",pcVar7,(ulong)uVar3,pcVar6);
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  iVar2 = fcntl(fds[0],2,1);
  if (iVar2 != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    pcVar6 = strerror(uVar3);
    pcVar7 = "PERFETTO_CHECK(fcntl(fds[0], F_SETFD, FD_CLOEXEC) == 0)";
    iVar2 = 0x1643;
    goto LAB_0029b6cf;
  }
  iVar2 = fcntl(fds[1],2,1);
  if (iVar2 != 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    pcVar6 = strerror(uVar3);
    pcVar7 = "PERFETTO_CHECK(fcntl(fds[1], F_SETFD, FD_CLOEXEC) == 0)";
    iVar2 = 0x1644;
    goto LAB_0029b6cf;
  }
  Pipe(this);
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(&this->rd,fds[0]);
  this_00 = &this->wr;
  ScopedResource<int,_&perfetto::base::CloseFile,_-1,_true,_perfetto::base::internal::DefaultValidityChecker<int,_-1>_>
  ::reset(this_00,fds[1]);
  if (flags - kBothNonBlock < 2) {
    uVar3 = fcntl((this->rd).t_,3,0);
    if ((int)uVar3 < 0) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      pcVar6 = strerror(uVar3);
      LogMessage(kLogError,pcVar4,0x164d,"%s (errno: %d, %s)","PERFETTO_CHECK(cur_flags >= 0)",
                 (ulong)uVar3,pcVar6);
      goto LAB_0029b7f7;
    }
    iVar2 = fcntl((this->rd).t_,4,(ulong)(uVar3 | 0x800));
    if (iVar2 != 0) {
      pcVar4 = Basename(
                       "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                       );
      puVar5 = (uint *)__errno_location();
      uVar3 = *puVar5;
      pcVar6 = strerror(uVar3);
      LogMessage(kLogError,pcVar4,0x164e,"%s (errno: %d, %s)",
                 "PERFETTO_CHECK(fcntl(*p.rd, F_SETFL, cur_flags | O_NONBLOCK) == 0)",(ulong)uVar3,
                 pcVar6);
      goto LAB_0029b7f7;
    }
  }
  if ((flags & ~kRdNonBlock) != kBothNonBlock) {
    return (Pipe)this;
  }
  uVar3 = fcntl(this_00->t_,3,0);
  if ((int)uVar3 < 0) {
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    pcVar6 = strerror(uVar3);
    LogMessage(kLogError,pcVar4,0x1653,"%s (errno: %d, %s)","PERFETTO_CHECK(cur_flags >= 0)",
               (ulong)uVar3,pcVar6);
  }
  else {
    iVar2 = fcntl(this_00->t_,4,(ulong)(uVar3 | 0x800));
    if (iVar2 == 0) {
      return (Pipe)this;
    }
    pcVar4 = Basename(
                     "/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc"
                     );
    puVar5 = (uint *)__errno_location();
    uVar3 = *puVar5;
    pcVar6 = strerror(uVar3);
    LogMessage(kLogError,pcVar4,0x1654,"%s (errno: %d, %s)",
               "PERFETTO_CHECK(fcntl(*p.wr, F_SETFL, cur_flags | O_NONBLOCK) == 0)",(ulong)uVar3,
               pcVar6);
  }
LAB_0029b7f7:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Pipe Pipe::Create(Flags flags) {
  PlatformHandle fds[2];
#if PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  PERFETTO_CHECK(::CreatePipe(&fds[0], &fds[1], /*lpPipeAttributes=*/nullptr,
                              0 /*default size*/));
#else
  PERFETTO_CHECK(pipe(fds) == 0);
  PERFETTO_CHECK(fcntl(fds[0], F_SETFD, FD_CLOEXEC) == 0);
  PERFETTO_CHECK(fcntl(fds[1], F_SETFD, FD_CLOEXEC) == 0);
#endif
  Pipe p;
  p.rd.reset(fds[0]);
  p.wr.reset(fds[1]);

#if !PERFETTO_BUILDFLAG(PERFETTO_OS_WIN)
  if (flags == kBothNonBlock || flags == kRdNonBlock) {
    int cur_flags = fcntl(*p.rd, F_GETFL, 0);
    PERFETTO_CHECK(cur_flags >= 0);
    PERFETTO_CHECK(fcntl(*p.rd, F_SETFL, cur_flags | O_NONBLOCK) == 0);
  }

  if (flags == kBothNonBlock || flags == kWrNonBlock) {
    int cur_flags = fcntl(*p.wr, F_GETFL, 0);
    PERFETTO_CHECK(cur_flags >= 0);
    PERFETTO_CHECK(fcntl(*p.wr, F_SETFL, cur_flags | O_NONBLOCK) == 0);
  }
#else
  PERFETTO_CHECK(flags == kBothBlock);
#endif
  return p;
}